

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O1

void google::LogDestination::FlushLogFiles(int min_severity)

{
  int iVar1;
  LogDestination *pLVar2;
  uint uVar3;
  pointer __p;
  __uniq_ptr_impl<google::LogDestination,_std::default_delete<google::LogDestination>_> *this;
  __uniq_ptr_impl<google::LogDestination,_std::default_delete<google::LogDestination>_> local_30;
  ulong uVar4;
  
  uVar4 = (ulong)(uint)min_severity;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)log_mutex);
  if (iVar1 == 0) {
    if (min_severity < 4) {
      do {
        this = (__uniq_ptr_impl<google::LogDestination,_std::default_delete<google::LogDestination>_>
                *)(&log_destinations_ + uVar4);
        if ((this->_M_t).
            super__Tuple_impl<0UL,_google::LogDestination_*,_std::default_delete<google::LogDestination>_>
            .super__Head_base<0UL,_google::LogDestination_*,_false>._M_head_impl ==
            (LogDestination *)0x0) {
          pLVar2 = (LogDestination *)operator_new(0xd0);
          LogDestination(pLVar2,(LogSeverity)uVar4,(char *)0x0);
          local_30._M_t.
          super__Tuple_impl<0UL,_google::LogDestination_*,_std::default_delete<google::LogDestination>_>
          .super__Head_base<0UL,_google::LogDestination_*,_false>._M_head_impl =
               (tuple<google::LogDestination_*,_std::default_delete<google::LogDestination>_>)
               (_Tuple_impl<0UL,_google::LogDestination_*,_std::default_delete<google::LogDestination>_>
                )0x0;
          std::__uniq_ptr_impl<google::LogDestination,_std::default_delete<google::LogDestination>_>
          ::reset(this,pLVar2);
          std::unique_ptr<google::LogDestination,_std::default_delete<google::LogDestination>_>::
          ~unique_ptr((unique_ptr<google::LogDestination,_std::default_delete<google::LogDestination>_>
                       *)&local_30);
        }
        pLVar2 = (this->_M_t).
                 super__Tuple_impl<0UL,_google::LogDestination_*,_std::default_delete<google::LogDestination>_>
                 .super__Head_base<0UL,_google::LogDestination_*,_false>._M_head_impl;
        if (pLVar2 != (LogDestination *)0x0) {
          (*pLVar2->logger_->_vptr_Logger[4])();
        }
        uVar3 = (LogSeverity)uVar4 + GLOG_WARNING;
        uVar4 = (ulong)uVar3;
      } while (uVar3 != 4);
    }
    pthread_mutex_unlock((pthread_mutex_t *)log_mutex);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

inline void LogDestination::FlushLogFiles(int min_severity) {
  // Prevent any subtle race conditions by wrapping a mutex lock around
  // all this stuff.
  std::lock_guard<std::mutex> l{log_mutex};
  for (int i = min_severity; i < NUM_SEVERITIES; i++) {
    LogDestination* log = log_destination(static_cast<LogSeverity>(i));
    if (log != nullptr) {
      log->logger_->Flush();
    }
  }
}